

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O3

TType * __thiscall glslang::TAnonMember::getWritableType(TAnonMember *this)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  
  if ((this->super_TSymbol).writable == false) {
    __assert_fail("writable",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SymbolTable.h"
                  ,0x181,"virtual TType &glslang::TAnonMember::getWritableType()");
  }
  iVar2 = (*(this->anonContainer->super_TSymbol)._vptr_TSymbol[0xc])();
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  cVar1 = (**(code **)(*plVar3 + 0x128))(plVar3);
  if (cVar1 != '\0') {
    return *(TType **)(*(long *)(plVar3[0xd] + 8) + (ulong)this->memberNumber * 0x20);
  }
  __assert_fail("isStruct()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
}

Assistant:

virtual TType& getWritableType() override
    {
        assert(writable);
        const TTypeList& types = *anonContainer.getType().getStruct();
        return *types[memberNumber].type;
    }